

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall
Catch::CompactReporter::assertionEnded(CompactReporter *this,AssertionStats *_assertionStats)

{
  bool bVar1;
  uint uVar2;
  OfType OVar3;
  element_type *peVar4;
  undefined1 local_68 [8];
  AssertionPrinter printer;
  bool printInfoMessages;
  AssertionResult *result;
  AssertionStats *_assertionStats_local;
  CompactReporter *this_local;
  
  printer._55_1_ = 1;
  peVar4 = clara::std::
           __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&(this->super_StreamingReporterBase<Catch::CompactReporter>).m_config);
  uVar2 = (*(peVar4->super_NonCopyable)._vptr_NonCopyable[5])();
  if (((uVar2 & 1) == 0) &&
     (bVar1 = AssertionResult::isOk(&_assertionStats->assertionResult), bVar1)) {
    OVar3 = AssertionResult::getResultType(&_assertionStats->assertionResult);
    if (OVar3 != Warning) {
      return false;
    }
    printer._55_1_ = 0;
  }
  anon_unknown_1::AssertionPrinter::AssertionPrinter
            ((AssertionPrinter *)local_68,
             (this->super_StreamingReporterBase<Catch::CompactReporter>).stream,_assertionStats,
             (bool)(printer._55_1_ & 1));
  anon_unknown_1::AssertionPrinter::print((AssertionPrinter *)local_68);
  std::ostream::operator<<
            ((this->super_StreamingReporterBase<Catch::CompactReporter>).stream,
             std::endl<char,std::char_traits<char>>);
  anon_unknown_1::AssertionPrinter::~AssertionPrinter((AssertionPrinter *)local_68);
  return true;
}

Assistant:

bool CompactReporter::assertionEnded( AssertionStats const& _assertionStats ) {
            AssertionResult const& result = _assertionStats.assertionResult;

            bool printInfoMessages = true;

            // Drop out if result was successful and we're not printing those
            if( !m_config->includeSuccessfulResults() && result.isOk() ) {
                if( result.getResultType() != ResultWas::Warning )
                    return false;
                printInfoMessages = false;
            }

            AssertionPrinter printer( stream, _assertionStats, printInfoMessages );
            printer.print();

            stream << std::endl;
            return true;
        }